

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp.hpp
# Opt level: O3

void duckdb::alp::AlpCompression<double,_true>::FindBestFactorAndExponent
               (double *input_vector,idx_t n_values,State *state)

{
  pointer pAVar1;
  AlpEncodingIndices AVar2;
  uint64_t uVar3;
  ulong uVar4;
  long lVar5;
  AlpEncodingIndices AVar6;
  ulong uVar7;
  ushort uVar8;
  uint64_t uVar9;
  AlpCombination *combination;
  pointer pAVar10;
  double dVar11;
  undefined1 auVar12 [16];
  vector<double,_true> vector_sample;
  vector<double,_true> local_58;
  State *local_38;
  
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish =
       (double *)0x0;
  local_58.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_38 = state;
  if (n_values != 0) {
    auVar12._8_4_ = (int)(n_values >> 0x20);
    auVar12._0_8_ = n_values;
    auVar12._12_4_ = 0x45300000;
    dVar11 = ceil(((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)n_values) - 4503599627370496.0)) * 0.03125);
    uVar4 = 1;
    if (1 < (uint)(long)dVar11) {
      uVar4 = (long)dVar11 & 0xffffffff;
    }
    uVar7 = 0;
    do {
      if (local_58.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_58.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  ((vector<double,std::allocator<double>> *)&local_58,
                   (iterator)
                   local_58.super_vector<double,_std::allocator<double>_>.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,input_vector);
      }
      else {
        *local_58.super_vector<double,_std::allocator<double>_>.
         super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_finish = *input_vector;
        local_58.super_vector<double,_std::allocator<double>_>.
        super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar7 = uVar7 + uVar4;
      input_vector = input_vector + uVar4;
    } while (uVar7 < n_values);
  }
  pAVar10 = (local_38->best_k_combinations).
            super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
            super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pAVar1 = (local_38->best_k_combinations).
           super_vector<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>.
           super__Vector_base<duckdb::alp::AlpCombination,_std::allocator<duckdb::alp::AlpCombination>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pAVar10 == pAVar1) {
    AVar2.exponent = '\0';
    AVar2.factor = '\0';
  }
  else {
    uVar9 = 0xffffffffffffffff;
    lVar5 = 0;
    uVar8 = 0;
    AVar6.exponent = '\0';
    AVar6.factor = '\0';
    do {
      uVar3 = DryCompressToEstimateSize<false>(&local_58,SUB42(*(undefined4 *)pAVar10,0));
      if (uVar3 < uVar9) {
        AVar6 = pAVar10->encoding_indices;
        uVar8 = (ushort)AVar6 >> 8;
        lVar5 = 0;
        uVar9 = uVar3;
      }
      else {
        lVar5 = lVar5 + 1;
        if (lVar5 == 2) break;
      }
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != pAVar1);
    AVar2 = (AlpEncodingIndices)((ushort)AVar6 & 0xff | uVar8 << 8);
  }
  local_38->vector_encoding_indices = AVar2;
  if (local_58.super_vector<double,_std::allocator<double>_>.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_58.super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

static void FindBestFactorAndExponent(const T *input_vector, idx_t n_values, State &state) {
		//! We sample equidistant values within a vector; to do this we skip a fixed number of values
		vector<T> vector_sample;
		auto idx_increments = MaxValue<uint32_t>(
		    1, ExactNumericCast<uint32_t>(std::ceil((double)n_values / AlpConstants::SAMPLES_PER_VECTOR)));
		for (idx_t i = 0; i < n_values; i += idx_increments) {
			vector_sample.push_back(input_vector[i]);
		}

		AlpEncodingIndices best_encoding_indices = {0, 0};
		uint64_t best_total_bits = NumericLimits<uint64_t>::Maximum();
		idx_t worse_total_bits_counter = 0;

		//! We try each K combination in search for the one which minimize the compression size in the vector
		for (auto &combination : state.best_k_combinations) {
			uint64_t estimated_compression_size =
			    DryCompressToEstimateSize<false>(vector_sample, combination.encoding_indices);

			// If current compression size is worse (higher) or equal than the current best combination
			if (estimated_compression_size >= best_total_bits) {
				worse_total_bits_counter += 1;
				// Early exit strategy
				if (worse_total_bits_counter == AlpConstants::SAMPLING_EARLY_EXIT_THRESHOLD) {
					break;
				}
				continue;
			}
			// Otherwise we replace the best and continue trying with the next combination
			best_total_bits = estimated_compression_size;
			best_encoding_indices = combination.encoding_indices;
			worse_total_bits_counter = 0;
		}
		state.vector_encoding_indices = best_encoding_indices;
	}